

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O2

void upb::generator::anon_unknown_5::WriteExtension
               (DefPoolPair *pools,FieldDefPtr ext,Output *output)

{
  FieldDefPtr field;
  upb_MiniTableField *field64;
  upb_MessageDef *this;
  undefined1 is_extension;
  FieldDefPtr ext_00;
  MessageDefPtr message;
  upb_MiniTableField *in_R8;
  string_view format;
  string_view format_00;
  string_view format_01;
  string_view format_02;
  string_view format_03;
  string_view format_04;
  string local_40;
  string *__return_storage_ptr__;
  
  format._M_str = "UPB_LINKARR_APPEND(upb_AllExts)\n";
  format._M_len = 0x20;
  Output::operator()<>(output,format);
  (anonymous_namespace)::ExtensionVarName_abi_cxx11_
            (&local_40,(_anonymous_namespace_ *)ext.ptr_,ext_00);
  format_00._M_str = "const upb_MiniTableExtension $0 = {\n  ";
  format_00._M_len = 0x26;
  Output::operator()(output,format_00,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  field.ptr_ = (upb_FieldDef *)DefPoolPair::GetFieldFromPool(&pools->pool64_,ext);
  field64 = DefPoolPair::GetFieldFromPool(&pools->pool32_,ext);
  FieldInitializer_abi_cxx11_(&local_40,(generator *)ext.ptr_,field,field64,in_R8);
  format_01._M_str = "$0,\n";
  format_01._M_len = 4;
  Output::operator()(output,format_01,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  this = upb_FieldDef_ContainingType(ext.ptr_);
  __return_storage_ptr__ = &local_40;
  (anonymous_namespace)::MessageVarName_abi_cxx11_
            (__return_storage_ptr__,(_anonymous_namespace_ *)this,message);
  format_02._M_str = "  &$0,\n";
  format_02._M_len = 7;
  Output::operator()(output,format_02,__return_storage_ptr__);
  is_extension = SUB81(__return_storage_ptr__,0);
  std::__cxx11::string::~string((string *)&local_40);
  (anonymous_namespace)::GetSub_abi_cxx11_
            (&local_40,(_anonymous_namespace_ *)ext.ptr_,(FieldDefPtr)0x1,(bool)is_extension);
  format_03._M_str = "  $0,\n";
  format_03._M_len = 6;
  Output::operator()(output,format_03,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  format_04._M_str = "\n};\n";
  format_04._M_len = 4;
  Output::operator()<>(output,format_04);
  return;
}

Assistant:

void WriteExtension(const DefPoolPair& pools, upb::FieldDefPtr ext,
                    Output& output) {
  output("UPB_LINKARR_APPEND(upb_AllExts)\n");
  output("const upb_MiniTableExtension $0 = {\n  ", ExtensionVarName(ext));
  output("$0,\n", FieldInitializer(pools, ext));
  output("  &$0,\n", MessageVarName(ext.containing_type()));
  output("  $0,\n", GetSub(ext, true));
  output("\n};\n");
}